

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCancellationTest.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_83776::SimpleTask::start(SimpleTask *this,TaskInterface ti)

{
  pointer pKVar1;
  pointer pKVar2;
  uintptr_t inputID;
  TaskInterface local_30;
  
  local_30.ctx = ti.ctx;
  local_30.impl = ti.impl;
  pKVar1 = (this->inputs).
           super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pKVar2 = (this->inputs).
           super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (inputID = 0; inputID != ((ulong)((long)pKVar1 - (long)pKVar2) >> 5 & 0xffffffff);
      inputID = inputID + 1) {
    llbuild::core::TaskInterface::request
              (&local_30,
               (this->inputs).
               super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
               _M_impl.super__Vector_impl_data._M_start + inputID,inputID);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Compute the list of inputs.
    auto inputs = listInputs();

    // Request all of the inputs.
    inputValues.resize(inputs.size());
    for (int i = 0, e = inputs.size(); i != e; ++i) {
      ti.request(inputs[i], i);
    }
  }